

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

void __thiscall
QFileSystemModelPrivate::fileSystemChanged
          (QFileSystemModelPrivate *this,QString *path,
          QList<std::pair<QString,_QFileInfo>_> *updates)

{
  int iVar1;
  QModelIndex *pQVar2;
  Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *pDVar3;
  QString *pQVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  QFileSystemNode *parentNode;
  Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *pNVar12;
  QFileSystemNode **ppQVar13;
  long lVar14;
  iterator iVar15;
  iterator iVar16;
  ulong uVar17;
  QArrayDataPointer<QString> *this_00;
  pair<QString,_QFileInfo> *ppVar18;
  qsizetype i;
  QFileSystemModelPrivate *this_01;
  pair<QString,_QFileInfo> *ppVar19;
  QString *value;
  QString *pQVar20;
  long in_FS_OFFSET;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QFileSystemNode *node;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 *local_118;
  undefined1 local_108 [32];
  undefined1 local_e8 [48];
  QString local_b8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QModelIndex **)&this->field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  parentNode = QFileSystemModelPrivate::node(this,path,false);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  index((QFileSystemModelPrivate *)local_98,(char *)this,(int)parentNode);
  lVar14 = (updates->d).size;
  if (lVar14 != 0) {
    ppVar19 = (updates->d).ptr;
    ppVar18 = ppVar19 + lVar14;
    do {
      local_b8.d.d = (ppVar19->first).d.d;
      local_b8.d.ptr = (ppVar19->first).d.ptr;
      local_b8.d.size = (ppVar19->first).d.size;
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileInfoGatherer::getInfo
                ((QExtendedInformation *)local_e8,
                 (QFileInfoGatherer *)
                 (this->fileInfoGatherer)._M_t.
                 super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                 .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl,&ppVar19->second);
      pDVar3 = (parentNode->children).d;
      if ((pDVar3 == (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>
                      *)0x0) ||
         (pNVar12 = QHashPrivate::
                    Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::
                    findNode<QString>(pDVar3,&local_b8),
         pNVar12 == (Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)0x0)) {
        this_01 = (QFileSystemModelPrivate *)local_108;
        QFileInfo::QFileInfo((QFileInfo *)local_108,(QFileInfo *)(local_e8 + 0x20));
        addNode(this_01,parentNode,&local_b8,(QFileInfo *)local_108);
        QFileInfo::~QFileInfo((QFileInfo *)local_108);
      }
      pDVar3 = (parentNode->children).d;
      if ((pDVar3 == (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>
                      *)0x0) ||
         (pNVar12 = QHashPrivate::
                    Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::
                    findNode<QString>(pDVar3,&local_b8),
         pNVar12 == (Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)0x0)) {
        ppQVar13 = (QFileSystemNode **)0x0;
      }
      else {
        ppQVar13 = &pNVar12->value;
      }
      if (ppQVar13 == (QFileSystemNode **)0x0) {
        local_108._0_8_ = (QFileSystemNode *)0x0;
      }
      else {
        local_108._0_8_ = *ppQVar13;
      }
      if (parentNode->info == (QExtendedInformation *)0x0) {
        cVar6 = '\0';
      }
      else {
        lVar14 = QFileInfo::d_func();
        cVar6 = qt_isCaseSensitive((QFileSystemEntry *)(lVar14 + 8),
                                   (QFileSystemMetaData *)(lVar14 + 0x40));
      }
      if (cVar6 == '\0') {
        iVar11 = QString::compare((QString *)local_108._0_8_,(CaseSensitivity)&local_b8);
        if (iVar11 == 0) goto LAB_00624c54;
      }
      else {
        lVar14 = (((QString *)local_108._0_8_)->d).size;
        if ((lVar14 == local_b8.d.size) &&
           (QVar21.m_data = (((QString *)local_108._0_8_)->d).ptr, QVar21.m_size = lVar14,
           QVar23.m_data = local_b8.d.ptr, QVar23.m_size = local_b8.d.size,
           cVar7 = QtPrivate::equalStrings(QVar21,QVar23), cVar7 != '\0')) {
LAB_00624c54:
          if (cVar6 == '\0') {
            QString::operator=((QString *)local_108._0_8_,&local_b8);
          }
          if ((*(QExtendedInformation **)(local_108._0_8_ + 0x38) == (QExtendedInformation *)0x0) ||
             (bVar8 = QExtendedInformation::operator==
                                (*(QExtendedInformation **)(local_108._0_8_ + 0x38),
                                 (QExtendedInformation *)local_e8), !bVar8)) {
            QFileSystemNode::populate
                      ((QFileSystemNode *)local_108._0_8_,(QExtendedInformation *)local_e8);
            QHash<QFileSystemModelPrivate::QFileSystemNode_const*,bool>::
            removeImpl<QFileSystemModelPrivate::QFileSystemNode_const*>
                      ((QHash<QFileSystemModelPrivate::QFileSystemNode_const*,bool> *)
                       &this->bypassFilters,(QFileSystemNode **)local_108);
            bVar8 = filtersAcceptsNode(this,(QFileSystemNode *)local_108._0_8_);
            if (bVar8) {
              if (*(bool *)(local_108._0_8_ + 0x4d) == false) {
                this_00 = &local_78;
                i = local_78.size;
              }
              else {
                this_00 = &local_58;
                i = local_58.size;
              }
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)this_00,i,&local_b8);
              QList<QString>::end((QList<QString> *)this_00);
            }
            else if (*(bool *)(local_108._0_8_ + 0x4d) != false) {
              QVar25.m_data = local_b8.d.ptr;
              QVar25.m_size = local_b8.d.size;
              iVar11 = QtPrivate::QStringList_indexOf
                                 ((QList_conflict *)&parentNode->visibleChildren,QVar25,0,
                                  CaseSensitive);
              removeVisibleFile(this,parentNode,iVar11);
            }
          }
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)(local_e8 + 0x20));
      QIcon::~QIcon((QIcon *)(local_e8 + 0x18));
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      ppVar19 = ppVar19 + 1;
    } while (ppVar19 != ppVar18);
  }
  iVar15 = QList<QString>::begin((QList<QString> *)&local_58);
  iVar16 = QList<QString>::end((QList<QString> *)&local_58);
  if (iVar15.i != iVar16.i) {
    uVar17 = ((long)iVar16.i - (long)iVar15.i >> 3) * -0x5555555555555555;
    lVar14 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::__introsort_loop<QList<QString>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar15.i,iVar16.i,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar15.i,iVar16.i);
  }
  local_e8._0_8_ = (QArrayData *)0x0;
  local_e8._8_8_ = (storage_type_conflict *)0x0;
  local_e8._16_8_ = 0;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (storage_type_conflict *)0x0;
  local_b8.d.size = 0;
  if (local_58.size != 0) {
    lVar14 = local_58.size * 0x18;
    pQVar20 = local_58.ptr;
    do {
      QString::operator=(&local_b8,pQVar20);
      QString::operator=((QString *)local_e8,pQVar20);
      QVar26.m_data = (storage_type_conflict *)local_e8._8_8_;
      QVar26.m_size = local_e8._16_8_;
      uVar9 = QtPrivate::QStringList_indexOf
                        ((QList_conflict *)&parentNode->visibleChildren,QVar26,0,CaseSensitive);
      QVar27.m_data = local_b8.d.ptr;
      QVar27.m_size = local_b8.d.size;
      uVar10 = QtPrivate::QStringList_indexOf
                         ((QList_conflict *)&parentNode->visibleChildren,QVar27,0,CaseSensitive);
      if ((-1 < (int)uVar9) &&
         (uVar17 = (ulong)(uVar9 & 0x7fffffff), uVar17 < (ulong)(parentNode->visibleChildren).d.size
         )) {
        pQVar4 = (parentNode->visibleChildren).d.ptr;
        lVar5 = pQVar4[uVar17].d.size;
        if (lVar5 == local_e8._16_8_) {
          QVar22.m_data = pQVar4[uVar17].d.ptr;
          QVar22.m_size = lVar5;
          QVar24.m_data = (storage_type_conflict *)local_e8._8_8_;
          QVar24.m_size = local_e8._16_8_;
          cVar6 = QtPrivate::equalStrings(QVar22,QVar24);
        }
        else {
          cVar6 = '\0';
        }
        if ((-1 < (int)uVar10) && (cVar6 != '\0')) {
          iVar11 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,local_98);
          local_108._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_108._8_4_ = 0xaaaaaaaa;
          local_108._12_4_ = 0xaaaaaaaa;
          if (this->sortOrder != AscendingOrder) {
            iVar1 = parentNode->dirtyChildrenIndex;
            if (iVar1 == -1) {
              uVar9 = ~uVar9 + (int)(parentNode->visibleChildren).d.size;
            }
            else if ((int)uVar9 < iVar1) {
              uVar9 = iVar1 + ~uVar9;
            }
          }
          (**(code **)(*(long *)pQVar2 + 0x60))(local_108,pQVar2,uVar9,0,local_98);
          local_118 = &DAT_aaaaaaaaaaaaaaaa;
          local_128 = 0xaaaaaaaa;
          uStack_124 = 0xaaaaaaaa;
          uStack_120 = 0xaaaaaaaa;
          uStack_11c = 0xaaaaaaaa;
          if (this->sortOrder != AscendingOrder) {
            iVar1 = parentNode->dirtyChildrenIndex;
            if (iVar1 == -1) {
              uVar10 = ~uVar10 + (int)(parentNode->visibleChildren).d.size;
            }
            else if ((int)uVar10 < iVar1) {
              uVar10 = iVar1 + ~uVar10;
            }
          }
          (**(code **)(*(long *)pQVar2 + 0x60))(&local_128,pQVar2,uVar10,iVar11 + -1,local_98);
          QAbstractItemModel::dataChanged
                    (pQVar2,(QModelIndex *)local_108,(QList_conflict *)&local_128);
        }
      }
      pQVar20 = pQVar20 + 1;
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != 0);
  }
  if (local_78.size != 0) {
    addVisibleFiles(this,parentNode,(QStringList *)&local_78);
  }
  if ((local_78.size != 0) || ((this->sortColumn != 0 && (local_58.size != 0)))) {
    this->forceSort = true;
    cVar6 = QTimer::isActive();
    if (cVar6 == '\0') {
      QTimer::start((int)this + 0xe8);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::fileSystemChanged(const QString &path,
                                                   const QList<std::pair<QString, QFileInfo>> &updates)
{
#if QT_CONFIG(filesystemwatcher)
    Q_Q(QFileSystemModel);
    QList<QString> rowsToUpdate;
    QStringList newFiles;
    QFileSystemModelPrivate::QFileSystemNode *parentNode = node(path, false);
    QModelIndex parentIndex = index(parentNode);
    for (const auto &update : updates) {
        QString fileName = update.first;
        Q_ASSERT(!fileName.isEmpty());
        QExtendedInformation info = fileInfoGatherer->getInfo(update.second);
        bool previouslyHere = parentNode->children.contains(fileName);
        if (!previouslyHere) {
#ifdef Q_OS_WIN
            chopSpaceAndDot(fileName);
            if (fileName.isEmpty())
                continue;
#endif
            addNode(parentNode, fileName, info.fileInfo());
        }
        QFileSystemModelPrivate::QFileSystemNode * node = parentNode->children.value(fileName);
        bool isCaseSensitive = parentNode->caseSensitive();
        if (isCaseSensitive) {
            if (node->fileName != fileName)
                continue;
        } else {
            if (QString::compare(node->fileName,fileName,Qt::CaseInsensitive) != 0)
                continue;
        }
        if (isCaseSensitive) {
            Q_ASSERT(node->fileName == fileName);
        } else {
            node->fileName = fileName;
        }

        if (*node != info ) {
            node->populate(info);
            bypassFilters.remove(node);
            // brand new information.
            if (filtersAcceptsNode(node)) {
                if (!node->isVisible) {
                    newFiles.append(fileName);
                } else {
                    rowsToUpdate.append(fileName);
                }
            } else {
                if (node->isVisible) {
                    int visibleLocation = parentNode->visibleLocation(fileName);
                    removeVisibleFile(parentNode, visibleLocation);
                } else {
                    // The file is not visible, don't do anything
                }
            }
        }
    }

    // bundle up all of the changed signals into as few as possible.
    std::sort(rowsToUpdate.begin(), rowsToUpdate.end());
    QString min;
    QString max;
    for (const QString &value : std::as_const(rowsToUpdate)) {
        //##TODO is there a way to bundle signals with QString as the content of the list?
        /*if (min.isEmpty()) {
            min = value;
            if (i != rowsToUpdate.count() - 1)
                continue;
        }
        if (i != rowsToUpdate.count() - 1) {
            if ((value == min + 1 && max.isEmpty()) || value == max + 1) {
                max = value;
                continue;
            }
        }*/
        max = value;
        min = value;
        int visibleMin = parentNode->visibleLocation(min);
        int visibleMax = parentNode->visibleLocation(max);
        if (visibleMin >= 0
            && visibleMin < parentNode->visibleChildren.size()
            && parentNode->visibleChildren.at(visibleMin) == min
            && visibleMax >= 0) {
            // don't use NumColumns here, a subclass might override columnCount
            const int lastColumn = q->columnCount(parentIndex) - 1;
            const QModelIndex top = q->index(translateVisibleLocation(parentNode, visibleMin),
                                             QFileSystemModelPrivate::NameColumn, parentIndex);
            const QModelIndex bottom = q->index(translateVisibleLocation(parentNode, visibleMax),
                                                lastColumn, parentIndex);
            // We document that emitting dataChanged with indexes that don't have the
            // same parent is undefined behavior.
            Q_ASSERT(bottom.parent() == top.parent());
            emit q->dataChanged(top, bottom);
        }

        /*min = QString();
        max = QString();*/
    }

    if (newFiles.size() > 0) {
        addVisibleFiles(parentNode, newFiles);
    }

    if (newFiles.size() > 0 || (sortColumn != 0 && rowsToUpdate.size() > 0)) {
        forceSort = true;
        delayedSort();
    }
#else
    Q_UNUSED(path);
    Q_UNUSED(updates);
#endif // filesystemwatcher
}